

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void google::protobuf::internal::WriteVarint(uint32_t num,uint64_t val,string *s)

{
  string *s_local;
  uint64_t val_local;
  uint32_t num_local;
  
  WriteVarint((ulong)(num << 3),s);
  WriteVarint(val,s);
  return;
}

Assistant:

void WriteVarint(uint32_t num, uint64_t val, std::string* s) {
  WriteVarint(num << 3, s);
  WriteVarint(val, s);
}